

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O0

FieldDescriptor **
google::protobuf::compiler::javanano::anon_unknown_0::SortFieldsByNumber(Descriptor *descriptor)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  FieldDescriptor **ppFVar4;
  FieldDescriptor *pFVar5;
  int local_1c;
  int i;
  FieldDescriptor **fields;
  Descriptor *descriptor_local;
  
  iVar2 = Descriptor::field_count(descriptor);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppFVar4 = (FieldDescriptor **)operator_new__(uVar3);
  local_1c = 0;
  while( true ) {
    iVar2 = Descriptor::field_count(descriptor);
    if (iVar2 <= local_1c) break;
    pFVar5 = Descriptor::field(descriptor,local_1c);
    ppFVar4[local_1c] = pFVar5;
    local_1c = local_1c + 1;
  }
  iVar2 = Descriptor::field_count(descriptor);
  std::
  sort<google::protobuf::FieldDescriptor_const**,google::protobuf::compiler::javanano::(anonymous_namespace)::FieldOrderingByNumber>
            (ppFVar4,ppFVar4 + iVar2);
  return ppFVar4;
}

Assistant:

const FieldDescriptor** SortFieldsByNumber(const Descriptor* descriptor) {
  const FieldDescriptor** fields =
    new const FieldDescriptor*[descriptor->field_count()];
  for (int i = 0; i < descriptor->field_count(); i++) {
    fields[i] = descriptor->field(i);
  }
  sort(fields, fields + descriptor->field_count(),
       FieldOrderingByNumber());
  return fields;
}